

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

int mpt_bind(mpt_socket *sd,char *where,mpt_fdmode *mode,int backlog)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  mpt_fdmode mVar7;
  ulong uVar8;
  socklen_t len;
  mpt_fdmode info;
  
  if (where == (char *)0x0) {
    iVar3 = sd->_id;
    if (iVar3 < 0) {
      return 0;
    }
    len = 0x6e;
    iVar4 = getsockname(iVar3,(sockaddr *)&info,&len);
    if (((-1 < iVar4) && (info._0_2_ == 1)) && (2 < len)) {
      unlink((char *)&info.param);
    }
    close(iVar3);
    sd->_id = -1;
    return 1;
  }
  if (mode == (mpt_fdmode *)0x0) {
    uVar5 = mpt_mode_parse(&info,where);
    mVar7 = info;
    if ((int)uVar5 < 0) goto LAB_00103a5b;
    if (uVar5 != 0) {
      mVar7 = (mpt_fdmode)((ulong)info & 0xff);
      uVar8 = (ulong)uVar5;
      goto LAB_0010397d;
    }
    info._0_2_ = info._0_2_ & 0xff00;
    info.stream = mVar7.stream;
    info.param = (anon_union_4_2_317a4d69_for_param)0x1;
    uVar8 = 0;
  }
  else {
    mVar7 = *mode;
    uVar8 = 0;
    info = mVar7;
LAB_0010397d:
    if (mVar7.family < '\0') {
      if (((ulong)info & 0x10000) != 0) {
LAB_00103a5b:
        piVar6 = __errno_location();
        *piVar6 = 0x16;
        return -1;
      }
      if (((ulong)info & 0x400000) == 0) {
LAB_00103a56:
        bVar1 = false;
        uVar2 = info.param.file.open;
      }
      else {
        iVar3 = mkfifo(where,(uint)info.param.file.perm);
        if (iVar3 < 0) {
          if (info.param._0_1_ < '\0') {
            return iVar3;
          }
          goto LAB_00103a56;
        }
        uVar2 = info.param.file.open & 0xff3f;
        info = (mpt_fdmode)((ulong)info & 0xffffffffff3fffff);
        bVar1 = true;
      }
      iVar3 = open(where + uVar8,(uint)uVar2,(ulong)info >> 0x20 & 0xffff);
      if (iVar3 < 0) {
        if (bVar1) {
          unlink(where);
          return iVar3;
        }
        return iVar3;
      }
      info = (mpt_fdmode)((ulong)info & 0xffffffff);
      goto LAB_00103ac9;
    }
  }
  iVar3 = socketSet(where + uVar8,&info,bind);
  if (iVar3 < 0) {
    return iVar3;
  }
  if (((-1 < backlog) && (info.stream == 7)) && (iVar4 = listen(iVar3,backlog), iVar4 < 0)) {
    close(iVar3);
    return -1;
  }
LAB_00103ac9:
  if (-1 < sd->_id) {
    close(sd->_id);
  }
  sd->_id = iVar3;
  return (uint)info.param.file.perm;
}

Assistant:

extern int mpt_bind(MPT_STRUCT(socket) *sd, const char *where, const MPT_STRUCT(fdmode) *mode, int backlog)
{
	MPT_STRUCT(fdmode) info;
	int sock;
	
	if (!where) {
		if ((sock = sd->_id) < 0) {
			return 0;
		}
		(void) socketUnbind(sock);
		(void) close(sock);
		sd->_id = -1;
		return 1;
	}
	/* use mode passed by caller */
	if (mode) {
		info = *mode;
		sock = 0;
	}
	/* detect mode based on prefix */
	else if ((sock = mpt_mode_parse(&info, where)) < 0) {
		errno = EINVAL;
		return -1;
	}
	/* no prefix detected: default to IP socket */
	else if (!sock) {
		info.family = AF_UNSPEC;
		info.param.sock.type = SOCK_STREAM;
		info.param.sock.proto = 0;
		info.param.sock.port = 0;
	}
	/* open as normal file */
	if (info.family < 0) {
		int res = -1;
		if (info.param.file.open & O_WRONLY) {
			errno = EINVAL;
			return -1;
		}
		if (info.param.file.open & O_CREAT) {
			if ((res = mkfifo(where, info.param.file.perm)) >= 0) {
				info.param.file.open &= ~(O_EXCL | O_CREAT);
			}
			else if (info.param.file.open & O_EXCL) {
				return res;
			}
		}
		if ((sock = open(where + sock, info.param.file.open, info.param.file.perm)) < 0) {
			if (res >= 0) {
				unlink(where);
			}
			return sock;
		}
		info.stream = 0;
		info.param.sock.port = 0;
	}
	/* bind socket to address */
	else if ((sock = socketSet(where + sock, &info, bind)) < 0) {
		return sock;
	}
	/* require listening state */
	else if ((info.stream == (MPT_SOCKETFLAG(Read) | MPT_SOCKETFLAG(Write) | MPT_SOCKETFLAG(Stream)))
	    && (backlog >= 0)
	    && listen(sock, backlog) < 0) {
		(void) close(sock);
		return -1;
	}
	if (sd->_id >= 0) {
		(void) close(sd->_id);
	}
	sd->_id = sock;
	
	return info.param.sock.port;
}